

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O0

SuffixTreeNode * __thiscall
wasm::SuffixTree::insertLeaf
          (SuffixTree *this,SuffixTreeInternalNode *Parent,uint StartIdx,uint Edge)

{
  SuffixTreeLeafNode *this_00;
  mapped_type *ppSVar1;
  SuffixTreeLeafNode *N;
  uint Edge_local;
  uint StartIdx_local;
  SuffixTreeInternalNode *Parent_local;
  SuffixTree *this_local;
  
  N._0_4_ = Edge;
  N._4_4_ = StartIdx;
  _Edge_local = Parent;
  Parent_local = (SuffixTreeInternalNode *)this;
  if (this->LeafEndIdx < StartIdx) {
    __assert_fail("StartIdx <= LeafEndIdx && \"String can\'t start after it ends!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                  ,0x3c,
                  "SuffixTreeNode *wasm::SuffixTree::insertLeaf(SuffixTreeInternalNode &, unsigned int, unsigned int)"
                 );
  }
  this_00 = llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode>::Allocate
                      (&this->LeafNodeAllocator,1);
  SuffixTreeLeafNode::SuffixTreeLeafNode(this_00,N._4_4_,&this->LeafEndIdx);
  ppSVar1 = std::
            unordered_map<unsigned_int,_wasm::SuffixTreeNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>_>
            ::operator[](&_Edge_local->Children,(key_type *)&N);
  *ppSVar1 = &this_00->super_SuffixTreeNode;
  return &this_00->super_SuffixTreeNode;
}

Assistant:

SuffixTreeNode* SuffixTree::insertLeaf(SuffixTreeInternalNode& Parent,
                                       unsigned StartIdx,
                                       unsigned Edge) {
  assert(StartIdx <= LeafEndIdx && "String can't start after it ends!");
  auto* N = new (LeafNodeAllocator.Allocate())
    SuffixTreeLeafNode(StartIdx, &LeafEndIdx);
  Parent.Children[Edge] = N;
  return N;
}